

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O2

bool __thiscall Kernel::OperatorType::isSingleSortType(OperatorType *this,TermList srt)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  TermList TVar4;
  uint i;
  uint idx;
  
  uVar1 = this->_typeArgsArity;
  iVar2 = *(int *)this->_key;
  idx = 0;
  do {
    if ((uVar1 + iVar2) - 1 == idx) {
      uVar3 = *(uint64_t *)(this->_key + ((ulong)(*(int *)this->_key - 1) * 2 + 2) * 4);
      return uVar3 == srt._content || ((uint)uVar3 & 3) == 2;
    }
    TVar4 = arg(this,idx);
    idx = idx + 1;
  } while (TVar4._content == srt._content);
  return false;
}

Assistant:

bool OperatorType::isSingleSortType(TermList srt) const
{
  unsigned len = arity();
  for (unsigned i = 0; i <len; i++) {
    if (arg(i) != srt) { //term comparison with != should be OK on the basis that both are shared terms
      return false;
    }
  }

  if (isFunctionType() && result() != srt) { 
    return false;
  }

  return true;
}